

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::iterate
          (VertexFeedbackOverflowCase *this)

{
  ostringstream *poVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  void *__src;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  char *description;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  allocator<char> local_1d1;
  long local_1d0;
  vector<float,_std::allocator<float>_> feedback;
  MessageBuilder local_1b0;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  iVar4 = (**(code **)(lVar8 + 0x780))((this->m_program->m_program).m_program,"a_position");
  if (iVar4 == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"a_position location was -1",(allocator<char> *)&feedback);
    tcu::TestError::TestError(pTVar7,(string *)&local_1b0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lVar8 + 0x19f0))(iVar4,4,0x1406,0,0,0);
  (**(code **)(lVar8 + 0x610))(iVar4);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar8 + 0x40))(0x8893,this->m_elementBuf);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"bind buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x1723);
  }
  (**(code **)(lVar8 + 0x48))(0x8c8e,0,this->m_feedbackBuf);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"bind buffer base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1727);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Capturing 2 triangles.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar8 + 0x30))(4);
  if (this->m_method == METHOD_DRAW_ARRAYS) {
    (**(code **)(lVar8 + 0x538))(5,0,4);
  }
  else if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar8 + 0x568))(4,6,0x1403,0);
  }
  (**(code **)(lVar8 + 0x638))();
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"capture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1735);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying final triangle was not partially written to the feedback buffer.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  __src = (void *)(**(code **)(lVar8 + 0xd00))(0x8c8e,0,0x50,1);
  feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x173e);
  if (__src != (void *)0x0) {
    std::vector<float,_std::allocator<float>_>::resize(&feedback,0x14);
    memcpy(feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start,__src,0x50);
    cVar2 = (**(code **)(lVar8 + 0x1670))(0x8c8e);
    if (cVar2 == '\x01') {
      poVar1 = &local_1b0.m_str;
      lVar8 = 0;
      bVar3 = 0;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        iVar4 = 0;
        lVar10 = 4;
        local_1d0 = lVar8;
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          if ((*(float *)((long)feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar8) != 1.0) ||
             (NAN(*(float *)((long)feedback.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar8)))) {
            local_1b0.m_log =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<((ostream *)poVar1,"Feedback buffer vertex ");
            std::ostream::operator<<(poVar1,(int)lVar9);
            std::operator<<((ostream *)poVar1,", component ");
            std::ostream::operator<<(poVar1,iVar4);
            std::operator<<((ostream *)poVar1,": unexpected value, expected 1.0, got ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_1b0,
                                (float *)((long)feedback.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start + lVar8));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            bVar3 = 1;
          }
          lVar8 = lVar8 + 4;
          iVar4 = iVar4 + 1;
        }
        lVar8 = local_1d0 + 0x10;
      }
      lVar9 = 0x30;
      poVar1 = &local_1b0.m_str;
      for (lVar8 = 3; lVar8 != 5; lVar8 = lVar8 + 1) {
        iVar4 = 0;
        lVar10 = 4;
        local_1d0 = lVar9;
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          if ((*(float *)((long)feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar9) != -1.0) ||
             (NAN(*(float *)((long)feedback.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar9)))) {
            local_1b0.m_log =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<((ostream *)poVar1,"Feedback buffer vertex ");
            std::ostream::operator<<(poVar1,(int)lVar8);
            std::operator<<((ostream *)poVar1,", component ");
            std::ostream::operator<<(poVar1,iVar4);
            std::operator<<((ostream *)poVar1,": unexpected value, expected -1.0, got ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_1b0,
                                (float *)((long)feedback.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start + lVar9));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            bVar3 = 1;
          }
          lVar9 = lVar9 + 4;
          iVar4 = iVar4 + 1;
        }
        lVar9 = local_1d0 + 0x10;
      }
      description = "Pass";
      if (bVar3 != 0) {
        description = "Feedback result validation failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar3,
                 description);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&feedback.super__Vector_base<float,_std::allocator<float>_>);
      return STOP;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"unmapBuffer returned false",&local_1d1);
    tcu::TestError::TestError(pTVar7,(string *)&local_1b0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"mapBufferRange returned null",&local_1d1);
  tcu::TestError::TestError(pTVar7,(string *)&local_1b0);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

VertexFeedbackOverflowCase::IterateResult VertexFeedbackOverflowCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");

	if (posLocation == -1)
		throw tcu::TestError("a_position location was -1");

	gl.useProgram(m_program->getProgram());

	gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);

	if (m_method == METHOD_DRAW_ELEMENTS)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuf);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffers");
	}

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_feedbackBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffer base");

	m_testCtx.getLog() << tcu::TestLog::Message << "Capturing 2 triangles." << tcu::TestLog::EndMessage;

	gl.beginTransformFeedback(GL_TRIANGLES);

	if (m_method == METHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_method == METHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	else
		DE_ASSERT(false);

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "capture");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying final triangle was not partially written to the feedback buffer." << tcu::TestLog::EndMessage;

	{
		const void*				ptr		= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(float[4]) * 5, GL_MAP_READ_BIT);
		std::vector<float>		feedback;
		bool					error	= false;

		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");
		if (!ptr)
			throw tcu::TestError("mapBufferRange returned null");

		feedback.resize(5*4);
		deMemcpy(&feedback[0], ptr, sizeof(float[4]) * 5);

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer returned false");

		// Verify vertices 0 - 2
		for (int vertex = 0; vertex < 3; ++vertex)
		{
			for (int component = 0; component < 4; ++component)
			{
				if (feedback[vertex*4 + component] != 1.0f)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Feedback buffer vertex " << vertex << ", component " << component << ": unexpected value, expected 1.0, got " << feedback[vertex*4 + component]
						<< tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}

		// Verify vertices 3 - 4
		for (int vertex = 3; vertex < 5; ++vertex)
		{
			for (int component = 0; component < 4; ++component)
			{
				if (feedback[vertex*4 + component] != -1.0f)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Feedback buffer vertex " << vertex << ", component " << component << ": unexpected value, expected -1.0, got " << feedback[vertex*4 + component]
						<< tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Feedback result validation failed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}